

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined4 uVar62;
  undefined1 auVar63 [32];
  undefined4 uVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  bool bVar78;
  long lVar79;
  long lVar80;
  byte bVar81;
  uint uVar82;
  int iVar83;
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong *puVar88;
  undefined1 auVar89 [8];
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  undefined1 auVar94 [16];
  float fVar93;
  float fVar102;
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar95 [16];
  float fVar104;
  undefined1 auVar96 [16];
  undefined1 auVar101 [32];
  vint4 bi;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  vint4 ai;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar126;
  undefined1 auVar125 [64];
  undefined1 auVar127 [32];
  float fVar129;
  undefined1 auVar128 [32];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar131 [32];
  float fVar141;
  undefined1 auVar142 [32];
  float fVar144;
  uint uVar145;
  float fVar146;
  uint uVar147;
  float fVar148;
  uint uVar149;
  float fVar150;
  uint uVar151;
  float fVar152;
  uint uVar153;
  float fVar154;
  uint uVar155;
  uint uVar156;
  undefined1 auVar143 [64];
  float fVar157;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [64];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  RTCFilterFunctionNArguments local_cb0;
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  undefined4 uStack_c04;
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float local_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined4 uStack_b64;
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined4 uStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar88 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_b90._4_4_ = uVar1;
  local_b90._0_4_ = uVar1;
  local_b90._8_4_ = uVar1;
  local_b90._12_4_ = uVar1;
  auVar121 = ZEXT1664(local_b90);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_ba0._4_4_ = uVar1;
  local_ba0._0_4_ = uVar1;
  local_ba0._8_4_ = uVar1;
  local_ba0._12_4_ = uVar1;
  auVar122 = ZEXT1664(local_ba0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_bb0._4_4_ = uVar1;
  local_bb0._0_4_ = uVar1;
  local_bb0._8_4_ = uVar1;
  local_bb0._12_4_ = uVar1;
  auVar125 = ZEXT1664(local_bb0);
  fVar93 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar102 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar103 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar87 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar91 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar90 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar83 = (tray->tnear).field_0.i[k];
  local_bf0._4_4_ = iVar83;
  local_bf0._0_4_ = iVar83;
  local_bf0._8_4_ = iVar83;
  local_bf0._12_4_ = iVar83;
  auVar143 = ZEXT1664(local_bf0);
  iVar83 = (tray->tfar).field_0.i[k];
  local_c00._4_4_ = iVar83;
  local_c00._0_4_ = iVar83;
  local_c00._8_4_ = iVar83;
  local_c00._12_4_ = iVar83;
  auVar159 = ZEXT1664(local_c00);
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  uVar82 = 1 << ((byte)k & 0x1f);
  auVar115._8_4_ = 0x3f800000;
  auVar115._0_8_ = 0x3f8000003f800000;
  auVar115._12_4_ = 0x3f800000;
  auVar115._16_4_ = 0x3f800000;
  auVar115._20_4_ = 0x3f800000;
  auVar115._24_4_ = 0x3f800000;
  auVar115._28_4_ = 0x3f800000;
  auVar97._8_4_ = 0xbf800000;
  auVar97._0_8_ = 0xbf800000bf800000;
  auVar97._12_4_ = 0xbf800000;
  auVar97._16_4_ = 0xbf800000;
  auVar97._20_4_ = 0xbf800000;
  auVar97._24_4_ = 0xbf800000;
  auVar97._28_4_ = 0xbf800000;
  _local_b80 = vblendvps_avx(auVar115,auVar97,local_b60);
  bVar78 = true;
  fVar104 = fVar93;
  fVar105 = fVar93;
  fVar106 = fVar93;
  fVar107 = fVar102;
  fVar126 = fVar102;
  fVar129 = fVar102;
  fVar132 = fVar103;
  fVar134 = fVar103;
  fVar136 = fVar103;
  local_be0 = fVar103;
  fStack_bdc = fVar103;
  fStack_bd8 = fVar103;
  fStack_bd4 = fVar103;
  local_bd0 = fVar102;
  fStack_bcc = fVar102;
  fStack_bc8 = fVar102;
  fStack_bc4 = fVar102;
  local_bc0 = fVar93;
  fStack_bbc = fVar93;
  fStack_bb8 = fVar93;
  fStack_bb4 = fVar93;
  do {
    uVar85 = puVar88[-1];
    puVar88 = puVar88 + -1;
    while ((uVar85 & 8) == 0) {
      auVar96 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar87),auVar121._0_16_);
      auVar94._0_4_ = fVar93 * auVar96._0_4_;
      auVar94._4_4_ = fVar104 * auVar96._4_4_;
      auVar94._8_4_ = fVar105 * auVar96._8_4_;
      auVar94._12_4_ = fVar106 * auVar96._12_4_;
      auVar96 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar91),auVar122._0_16_);
      auVar95._0_4_ = fVar102 * auVar96._0_4_;
      auVar95._4_4_ = fVar107 * auVar96._4_4_;
      auVar95._8_4_ = fVar126 * auVar96._8_4_;
      auVar95._12_4_ = fVar129 * auVar96._12_4_;
      auVar96 = vpmaxsd_avx(auVar94,auVar95);
      auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar90),auVar125._0_16_);
      auVar108._0_4_ = fVar103 * auVar94._0_4_;
      auVar108._4_4_ = fVar132 * auVar94._4_4_;
      auVar108._8_4_ = fVar134 * auVar94._8_4_;
      auVar108._12_4_ = fVar136 * auVar94._12_4_;
      auVar94 = vpmaxsd_avx(auVar108,auVar143._0_16_);
      auVar96 = vpmaxsd_avx(auVar96,auVar94);
      auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + (uVar87 ^ 0x10)),auVar121._0_16_);
      auVar109._0_4_ = fVar93 * auVar94._0_4_;
      auVar109._4_4_ = fVar104 * auVar94._4_4_;
      auVar109._8_4_ = fVar105 * auVar94._8_4_;
      auVar109._12_4_ = fVar106 * auVar94._12_4_;
      auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + (uVar91 ^ 0x10)),auVar122._0_16_);
      auVar113._0_4_ = fVar102 * auVar94._0_4_;
      auVar113._4_4_ = fVar107 * auVar94._4_4_;
      auVar113._8_4_ = fVar126 * auVar94._8_4_;
      auVar113._12_4_ = fVar129 * auVar94._12_4_;
      auVar94 = vpminsd_avx(auVar109,auVar113);
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + (uVar90 ^ 0x10)),auVar125._0_16_);
      auVar114._0_4_ = fVar103 * auVar95._0_4_;
      auVar114._4_4_ = fVar132 * auVar95._4_4_;
      auVar114._8_4_ = fVar134 * auVar95._8_4_;
      auVar114._12_4_ = fVar136 * auVar95._12_4_;
      auVar95 = vpminsd_avx(auVar114,auVar159._0_16_);
      auVar94 = vpminsd_avx(auVar94,auVar95);
      auVar96 = vpcmpgtd_avx(auVar96,auVar94);
      iVar83 = vmovmskps_avx(auVar96);
      if (iVar83 == 0xf) goto joined_r0x0039dc98;
      bVar81 = (byte)iVar83 ^ 0xf;
      uVar92 = uVar85 & 0xfffffffffffffff0;
      lVar80 = 0;
      if (bVar81 != 0) {
        for (; (bVar81 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
        }
      }
      uVar85 = *(ulong *)(uVar92 + lVar80 * 8);
      uVar84 = bVar81 - 1 & (uint)bVar81;
      if (uVar84 != 0) {
        *puVar88 = uVar85;
        puVar88 = puVar88 + 1;
        lVar80 = 0;
        if (uVar84 != 0) {
          for (; (uVar84 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
          }
        }
        uVar85 = *(ulong *)(uVar92 + lVar80 * 8);
        uVar84 = uVar84 - 1 & uVar84;
        uVar86 = (ulong)uVar84;
        if (uVar84 != 0) {
          do {
            *puVar88 = uVar85;
            puVar88 = puVar88 + 1;
            lVar80 = 0;
            if (uVar86 != 0) {
              for (; (uVar86 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
              }
            }
            uVar85 = *(ulong *)(uVar92 + lVar80 * 8);
            uVar86 = uVar86 & uVar86 - 1;
          } while (uVar86 != 0);
        }
      }
    }
    uVar92 = (ulong)((uint)uVar85 & 0xf);
    if (uVar92 != 8) {
      uVar85 = uVar85 & 0xfffffffffffffff0;
      lVar80 = 0;
      do {
        lVar79 = lVar80 * 0x60;
        auVar89 = (undefined1  [8])context->scene;
        ppfVar4 = (((Scene *)auVar89)->vertices).items;
        pfVar5 = ppfVar4[*(uint *)(uVar85 + 0x40 + lVar79)];
        pfVar6 = ppfVar4[*(uint *)(uVar85 + 0x44 + lVar79)];
        pfVar7 = ppfVar4[*(uint *)(uVar85 + 0x48 + lVar79)];
        pfVar8 = ppfVar4[*(uint *)(uVar85 + 0x4c + lVar79)];
        auVar95 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + lVar79)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 8 + lVar79)));
        auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + lVar79)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 8 + lVar79)));
        auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 4 + lVar79)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0xc + lVar79)));
        auVar94 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 4 + lVar79)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0xc + lVar79)));
        auVar113 = vunpcklps_avx(auVar96,auVar94);
        auVar114 = vunpcklps_avx(auVar95,auVar108);
        auVar94 = vunpckhps_avx(auVar95,auVar108);
        auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + 0x10 + lVar79)),
                                 *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x18 + lVar79)))
        ;
        auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + 0x10 + lVar79)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x18 + lVar79)));
        auVar109 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x14 + lVar79)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x1c + lVar79)))
        ;
        auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x14 + lVar79)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x1c + lVar79)));
        auVar54 = vunpcklps_avx(auVar96,auVar95);
        auVar55 = vunpcklps_avx(auVar108,auVar109);
        auVar95 = vunpckhps_avx(auVar108,auVar109);
        auVar109 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + 0x20 + lVar79)),
                                 *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x28 + lVar79)))
        ;
        auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + 0x20 + lVar79)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x28 + lVar79)));
        auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x24 + lVar79)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x2c + lVar79)));
        auVar108 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x24 + lVar79)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x2c + lVar79)))
        ;
        auVar57 = vunpcklps_avx(auVar96,auVar108);
        auVar58 = vunpcklps_avx(auVar109,auVar56);
        auVar108 = vunpckhps_avx(auVar109,auVar56);
        auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + 0x30 + lVar79)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x38 + lVar79)));
        auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar85 + 0x30 + lVar79)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x38 + lVar79)));
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x34 + lVar79)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x3c + lVar79)));
        auVar109 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x34 + lVar79)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x3c + lVar79)))
        ;
        auVar60 = vunpcklps_avx(auVar96,auVar109);
        auVar61 = vunpcklps_avx(auVar56,auVar59);
        auVar96 = *(undefined1 (*) [16])(uVar85 + 0x40 + lVar79);
        local_b20._16_16_ = auVar96;
        local_b20._0_16_ = auVar96;
        auVar109 = vunpckhps_avx(auVar56,auVar59);
        lVar79 = uVar85 + 0x50 + lVar79;
        local_b40 = *(undefined8 *)(lVar79 + 0x10);
        uStack_b38 = *(undefined8 *)(lVar79 + 0x18);
        uStack_b30 = local_b40;
        uStack_b28 = uStack_b38;
        auVar127._16_16_ = auVar58;
        auVar127._0_16_ = auVar114;
        auVar128._16_16_ = auVar108;
        auVar128._0_16_ = auVar94;
        auVar131._16_16_ = auVar57;
        auVar131._0_16_ = auVar113;
        auVar110._16_16_ = auVar55;
        auVar110._0_16_ = auVar55;
        auVar123._16_16_ = auVar95;
        auVar123._0_16_ = auVar95;
        auVar116._16_16_ = auVar54;
        auVar116._0_16_ = auVar54;
        auVar142._16_16_ = auVar61;
        auVar142._0_16_ = auVar61;
        auVar158._16_16_ = auVar109;
        auVar158._0_16_ = auVar109;
        auVar98._16_16_ = auVar60;
        auVar98._0_16_ = auVar60;
        local_c40 = vsubps_avx(auVar127,auVar110);
        auVar97 = vsubps_avx(auVar128,auVar123);
        auVar115 = vsubps_avx(auVar131,auVar116);
        auVar100 = vsubps_avx(auVar142,auVar127);
        auVar110 = vsubps_avx(auVar158,auVar128);
        auVar98 = vsubps_avx(auVar98,auVar131);
        fVar104 = auVar97._0_4_;
        fVar166 = auVar98._0_4_;
        fVar134 = auVar97._4_4_;
        fVar167 = auVar98._4_4_;
        auVar52._4_4_ = fVar167 * fVar134;
        auVar52._0_4_ = fVar166 * fVar104;
        fVar17 = auVar97._8_4_;
        fVar168 = auVar98._8_4_;
        auVar52._8_4_ = fVar168 * fVar17;
        fVar24 = auVar97._12_4_;
        fVar169 = auVar98._12_4_;
        auVar52._12_4_ = fVar169 * fVar24;
        fVar31 = auVar97._16_4_;
        fVar170 = auVar98._16_4_;
        auVar52._16_4_ = fVar170 * fVar31;
        fVar38 = auVar97._20_4_;
        fVar171 = auVar98._20_4_;
        auVar52._20_4_ = fVar171 * fVar38;
        fVar45 = auVar97._24_4_;
        fVar172 = auVar98._24_4_;
        auVar52._24_4_ = fVar172 * fVar45;
        auVar52._28_4_ = auVar60._12_4_;
        fVar105 = auVar115._0_4_;
        fVar157 = auVar110._0_4_;
        fVar136 = auVar115._4_4_;
        fVar160 = auVar110._4_4_;
        auVar53._4_4_ = fVar160 * fVar136;
        auVar53._0_4_ = fVar157 * fVar105;
        fVar18 = auVar115._8_4_;
        fVar161 = auVar110._8_4_;
        auVar53._8_4_ = fVar161 * fVar18;
        fVar25 = auVar115._12_4_;
        fVar162 = auVar110._12_4_;
        auVar53._12_4_ = fVar162 * fVar25;
        fVar32 = auVar115._16_4_;
        fVar163 = auVar110._16_4_;
        auVar53._16_4_ = fVar163 * fVar32;
        fVar39 = auVar115._20_4_;
        fVar164 = auVar110._20_4_;
        auVar53._20_4_ = fVar164 * fVar39;
        fVar46 = auVar115._24_4_;
        uVar62 = auVar55._12_4_;
        fVar165 = auVar110._24_4_;
        auVar53._24_4_ = fVar165 * fVar46;
        auVar53._28_4_ = uVar62;
        local_c60 = vsubps_avx(auVar53,auVar52);
        fVar141 = auVar100._0_4_;
        fVar144 = auVar100._4_4_;
        auVar63._4_4_ = fVar144 * fVar136;
        auVar63._0_4_ = fVar141 * fVar105;
        fVar146 = auVar100._8_4_;
        auVar63._8_4_ = fVar146 * fVar18;
        fVar148 = auVar100._12_4_;
        auVar63._12_4_ = fVar148 * fVar25;
        fVar150 = auVar100._16_4_;
        auVar63._16_4_ = fVar150 * fVar32;
        fVar152 = auVar100._20_4_;
        auVar63._20_4_ = fVar152 * fVar39;
        fVar154 = auVar100._24_4_;
        auVar63._24_4_ = fVar154 * fVar46;
        auVar63._28_4_ = uVar62;
        fVar106 = local_c40._0_4_;
        fVar12 = local_c40._4_4_;
        auVar65._4_4_ = fVar167 * fVar12;
        auVar65._0_4_ = fVar166 * fVar106;
        fVar19 = local_c40._8_4_;
        auVar65._8_4_ = fVar168 * fVar19;
        fVar26 = local_c40._12_4_;
        auVar65._12_4_ = fVar169 * fVar26;
        fVar33 = local_c40._16_4_;
        auVar65._16_4_ = fVar170 * fVar33;
        fVar40 = local_c40._20_4_;
        auVar65._20_4_ = fVar171 * fVar40;
        fVar47 = local_c40._24_4_;
        uVar64 = auVar54._12_4_;
        auVar65._24_4_ = fVar172 * fVar47;
        auVar65._28_4_ = uVar64;
        _local_c20 = vsubps_avx(auVar65,auVar63);
        auVar66._4_4_ = fVar160 * fVar12;
        auVar66._0_4_ = fVar157 * fVar106;
        auVar66._8_4_ = fVar161 * fVar19;
        auVar66._12_4_ = fVar162 * fVar26;
        auVar66._16_4_ = fVar163 * fVar33;
        auVar66._20_4_ = fVar164 * fVar40;
        auVar66._24_4_ = fVar165 * fVar47;
        auVar66._28_4_ = uVar64;
        auVar67._4_4_ = fVar144 * fVar134;
        auVar67._0_4_ = fVar141 * fVar104;
        auVar67._8_4_ = fVar146 * fVar17;
        auVar67._12_4_ = fVar148 * fVar24;
        auVar67._16_4_ = fVar150 * fVar31;
        auVar67._20_4_ = fVar152 * fVar38;
        auVar67._24_4_ = fVar154 * fVar45;
        auVar67._28_4_ = auVar96._12_4_;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar173._4_4_ = uVar1;
        auVar173._0_4_ = uVar1;
        auVar173._8_4_ = uVar1;
        auVar173._12_4_ = uVar1;
        auVar173._16_4_ = uVar1;
        auVar173._20_4_ = uVar1;
        auVar173._24_4_ = uVar1;
        auVar173._28_4_ = uVar1;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar174._4_4_ = uVar2;
        auVar174._0_4_ = uVar2;
        auVar174._8_4_ = uVar2;
        auVar174._12_4_ = uVar2;
        auVar174._16_4_ = uVar2;
        auVar174._20_4_ = uVar2;
        auVar174._24_4_ = uVar2;
        auVar174._28_4_ = uVar2;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar175._4_4_ = uVar3;
        auVar175._0_4_ = uVar3;
        auVar175._8_4_ = uVar3;
        auVar175._12_4_ = uVar3;
        auVar175._16_4_ = uVar3;
        auVar175._20_4_ = uVar3;
        auVar175._24_4_ = uVar3;
        auVar175._28_4_ = uVar3;
        fVar93 = *(float *)(ray + k * 4 + 0xa0);
        local_a40 = vsubps_avx(auVar67,auVar66);
        auVar97 = vsubps_avx(auVar127,auVar173);
        fVar102 = *(float *)(ray + k * 4 + 0xc0);
        auVar115 = vsubps_avx(auVar128,auVar174);
        auVar52 = vsubps_avx(auVar131,auVar175);
        fVar130 = auVar52._0_4_;
        fVar133 = auVar52._4_4_;
        auVar68._4_4_ = fVar133 * fVar93;
        auVar68._0_4_ = fVar130 * fVar93;
        fVar135 = auVar52._8_4_;
        auVar68._8_4_ = fVar135 * fVar93;
        fVar137 = auVar52._12_4_;
        auVar68._12_4_ = fVar137 * fVar93;
        fVar138 = auVar52._16_4_;
        auVar68._16_4_ = fVar138 * fVar93;
        fVar139 = auVar52._20_4_;
        auVar68._20_4_ = fVar139 * fVar93;
        fVar140 = auVar52._24_4_;
        auVar68._24_4_ = fVar140 * fVar93;
        auVar68._28_4_ = uVar1;
        fVar107 = auVar115._0_4_;
        fVar13 = auVar115._4_4_;
        auVar69._4_4_ = fVar102 * fVar13;
        auVar69._0_4_ = fVar102 * fVar107;
        fVar20 = auVar115._8_4_;
        auVar69._8_4_ = fVar102 * fVar20;
        fVar27 = auVar115._12_4_;
        auVar69._12_4_ = fVar102 * fVar27;
        fVar34 = auVar115._16_4_;
        auVar69._16_4_ = fVar102 * fVar34;
        fVar41 = auVar115._20_4_;
        auVar69._20_4_ = fVar102 * fVar41;
        fVar48 = auVar115._24_4_;
        auVar69._24_4_ = fVar102 * fVar48;
        auVar69._28_4_ = uVar2;
        auVar115 = vsubps_avx(auVar69,auVar68);
        fVar103 = *(float *)(ray + k * 4 + 0x80);
        fVar126 = auVar97._0_4_;
        fVar14 = auVar97._4_4_;
        auVar70._4_4_ = fVar102 * fVar14;
        auVar70._0_4_ = fVar102 * fVar126;
        fVar21 = auVar97._8_4_;
        auVar70._8_4_ = fVar102 * fVar21;
        fVar28 = auVar97._12_4_;
        auVar70._12_4_ = fVar102 * fVar28;
        fVar35 = auVar97._16_4_;
        auVar70._16_4_ = fVar102 * fVar35;
        fVar42 = auVar97._20_4_;
        auVar70._20_4_ = fVar102 * fVar42;
        fVar49 = auVar97._24_4_;
        auVar70._24_4_ = fVar102 * fVar49;
        auVar70._28_4_ = uVar3;
        auVar71._4_4_ = fVar133 * fVar103;
        auVar71._0_4_ = fVar130 * fVar103;
        auVar71._8_4_ = fVar135 * fVar103;
        auVar71._12_4_ = fVar137 * fVar103;
        auVar71._16_4_ = fVar138 * fVar103;
        auVar71._20_4_ = fVar139 * fVar103;
        auVar71._24_4_ = fVar140 * fVar103;
        auVar71._28_4_ = uVar62;
        auVar52 = vsubps_avx(auVar71,auVar70);
        auVar72._4_4_ = fVar103 * fVar13;
        auVar72._0_4_ = fVar103 * fVar107;
        auVar72._8_4_ = fVar103 * fVar20;
        auVar72._12_4_ = fVar103 * fVar27;
        auVar72._16_4_ = fVar103 * fVar34;
        auVar72._20_4_ = fVar103 * fVar41;
        auVar72._24_4_ = fVar103 * fVar48;
        auVar72._28_4_ = uVar3;
        auVar73._4_4_ = fVar14 * fVar93;
        auVar73._0_4_ = fVar126 * fVar93;
        auVar73._8_4_ = fVar21 * fVar93;
        auVar73._12_4_ = fVar28 * fVar93;
        auVar73._16_4_ = fVar35 * fVar93;
        auVar73._20_4_ = fVar42 * fVar93;
        auVar73._24_4_ = fVar49 * fVar93;
        auVar73._28_4_ = uVar64;
        auVar53 = vsubps_avx(auVar73,auVar72);
        fVar129 = local_a40._0_4_;
        fVar15 = local_a40._4_4_;
        fVar22 = local_a40._8_4_;
        fVar29 = local_a40._12_4_;
        fVar36 = local_a40._16_4_;
        fVar43 = local_a40._20_4_;
        fVar50 = local_a40._24_4_;
        fVar132 = local_c60._0_4_;
        fVar16 = local_c60._4_4_;
        fVar23 = local_c60._8_4_;
        fVar30 = local_c60._12_4_;
        fVar37 = local_c60._16_4_;
        fVar44 = local_c60._20_4_;
        fVar51 = local_c60._24_4_;
        auVar99._0_4_ = fVar103 * fVar132 + fVar102 * fVar129 + (float)local_c20._0_4_ * fVar93;
        auVar99._4_4_ = fVar103 * fVar16 + fVar102 * fVar15 + (float)local_c20._4_4_ * fVar93;
        auVar99._8_4_ = fVar103 * fVar23 + fVar102 * fVar22 + fStack_c18 * fVar93;
        auVar99._12_4_ = fVar103 * fVar30 + fVar102 * fVar29 + fStack_c14 * fVar93;
        auVar99._16_4_ = fVar103 * fVar37 + fVar102 * fVar36 + fStack_c10 * fVar93;
        auVar99._20_4_ = fVar103 * fVar44 + fVar102 * fVar43 + fStack_c0c * fVar93;
        auVar99._24_4_ = fVar103 * fVar51 + fVar102 * fVar50 + fStack_c08 * fVar93;
        auVar99._28_4_ = fVar102 + fVar102 + fVar93;
        auVar117._8_4_ = 0x80000000;
        auVar117._0_8_ = 0x8000000080000000;
        auVar117._12_4_ = 0x80000000;
        auVar117._16_4_ = 0x80000000;
        auVar117._20_4_ = 0x80000000;
        auVar117._24_4_ = 0x80000000;
        auVar117._28_4_ = 0x80000000;
        auVar97 = vandps_avx(auVar99,auVar117);
        uVar84 = auVar97._0_4_;
        local_b00._0_4_ =
             (float)(uVar84 ^ (uint)(fVar141 * auVar115._0_4_ +
                                    fVar166 * auVar53._0_4_ + fVar157 * auVar52._0_4_));
        uVar145 = auVar97._4_4_;
        local_b00._4_4_ =
             (float)(uVar145 ^
                    (uint)(fVar144 * auVar115._4_4_ +
                          fVar167 * auVar53._4_4_ + fVar160 * auVar52._4_4_));
        uVar147 = auVar97._8_4_;
        local_b00._8_4_ =
             (float)(uVar147 ^
                    (uint)(fVar146 * auVar115._8_4_ +
                          fVar168 * auVar53._8_4_ + fVar161 * auVar52._8_4_));
        uVar149 = auVar97._12_4_;
        local_b00._12_4_ =
             (float)(uVar149 ^
                    (uint)(fVar148 * auVar115._12_4_ +
                          fVar169 * auVar53._12_4_ + fVar162 * auVar52._12_4_));
        uVar151 = auVar97._16_4_;
        local_b00._16_4_ =
             (float)(uVar151 ^
                    (uint)(fVar150 * auVar115._16_4_ +
                          fVar170 * auVar53._16_4_ + fVar163 * auVar52._16_4_));
        uVar153 = auVar97._20_4_;
        local_b00._20_4_ =
             (float)(uVar153 ^
                    (uint)(fVar152 * auVar115._20_4_ +
                          fVar171 * auVar53._20_4_ + fVar164 * auVar52._20_4_));
        uVar155 = auVar97._24_4_;
        local_b00._24_4_ =
             (float)(uVar155 ^
                    (uint)(fVar154 * auVar115._24_4_ +
                          fVar172 * auVar53._24_4_ + fVar165 * auVar52._24_4_));
        uVar156 = auVar97._28_4_;
        local_b00._28_4_ =
             (float)(uVar156 ^ (uint)(auVar100._28_4_ + auVar98._28_4_ + auVar110._28_4_));
        local_ae0._0_4_ =
             (float)(uVar84 ^ (uint)(auVar115._0_4_ * fVar106 +
                                    fVar105 * auVar53._0_4_ + fVar104 * auVar52._0_4_));
        local_ae0._4_4_ =
             (float)(uVar145 ^
                    (uint)(auVar115._4_4_ * fVar12 +
                          fVar136 * auVar53._4_4_ + fVar134 * auVar52._4_4_));
        local_ae0._8_4_ =
             (float)(uVar147 ^
                    (uint)(auVar115._8_4_ * fVar19 + fVar18 * auVar53._8_4_ + fVar17 * auVar52._8_4_
                          ));
        local_ae0._12_4_ =
             (float)(uVar149 ^
                    (uint)(auVar115._12_4_ * fVar26 +
                          fVar25 * auVar53._12_4_ + fVar24 * auVar52._12_4_));
        local_ae0._16_4_ =
             (float)(uVar151 ^
                    (uint)(auVar115._16_4_ * fVar33 +
                          fVar32 * auVar53._16_4_ + fVar31 * auVar52._16_4_));
        local_ae0._20_4_ =
             (float)(uVar153 ^
                    (uint)(auVar115._20_4_ * fVar40 +
                          fVar39 * auVar53._20_4_ + fVar38 * auVar52._20_4_));
        local_ae0._24_4_ =
             (float)(uVar155 ^
                    (uint)(auVar115._24_4_ * fVar47 +
                          fVar46 * auVar53._24_4_ + fVar45 * auVar52._24_4_));
        local_ae0._28_4_ = (float)(uVar156 ^ (uint)(auVar53._28_4_ + auVar52._28_4_ + -0.0));
        auVar115 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar97 = vcmpps_avx(local_b00,auVar115,5);
        auVar115 = vcmpps_avx(local_ae0,auVar115,5);
        auVar97 = vandps_avx(auVar97,auVar115);
        auVar118._8_4_ = 0x7fffffff;
        auVar118._0_8_ = 0x7fffffff7fffffff;
        auVar118._12_4_ = 0x7fffffff;
        auVar118._16_4_ = 0x7fffffff;
        auVar118._20_4_ = 0x7fffffff;
        auVar118._24_4_ = 0x7fffffff;
        auVar118._28_4_ = 0x7fffffff;
        local_aa0 = vandps_avx(auVar99,auVar118);
        auVar115 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar99,4);
        auVar97 = vandps_avx(auVar97,auVar115);
        auVar100._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
        auVar100._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
        auVar100._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
        auVar100._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
        auVar100._16_4_ = local_b00._16_4_ + local_ae0._16_4_;
        auVar100._20_4_ = local_b00._20_4_ + local_ae0._20_4_;
        auVar100._24_4_ = local_b00._24_4_ + local_ae0._24_4_;
        auVar100._28_4_ = local_b00._28_4_ + local_ae0._28_4_;
        auVar115 = vcmpps_avx(auVar100,local_aa0,2);
        auVar100 = auVar115 & auVar97;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          auVar97 = vandps_avx(auVar97,auVar115);
          auVar96 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
          local_ac0._0_4_ =
               (float)(uVar84 ^ (uint)(fVar132 * fVar126 +
                                      (float)local_c20._0_4_ * fVar107 + fVar130 * fVar129));
          local_ac0._4_4_ =
               (float)(uVar145 ^
                      (uint)(fVar16 * fVar14 + (float)local_c20._4_4_ * fVar13 + fVar133 * fVar15));
          local_ac0._8_4_ =
               (float)(uVar147 ^ (uint)(fVar23 * fVar21 + fStack_c18 * fVar20 + fVar135 * fVar22));
          local_ac0._12_4_ =
               (float)(uVar149 ^ (uint)(fVar30 * fVar28 + fStack_c14 * fVar27 + fVar137 * fVar29));
          local_ac0._16_4_ =
               (float)(uVar151 ^ (uint)(fVar37 * fVar35 + fStack_c10 * fVar34 + fVar138 * fVar36));
          local_ac0._20_4_ =
               (float)(uVar153 ^ (uint)(fVar44 * fVar42 + fStack_c0c * fVar41 + fVar139 * fVar43));
          local_ac0._24_4_ =
               (float)(uVar155 ^ (uint)(fVar51 * fVar49 + fStack_c08 * fVar48 + fVar140 * fVar50));
          local_ac0._28_4_ = uVar156 ^ 0x7fc00000;
          fVar93 = *(float *)(ray + k * 4 + 0x60);
          fVar102 = local_aa0._0_4_;
          fVar103 = local_aa0._4_4_;
          auVar74._4_4_ = fVar103 * fVar93;
          auVar74._0_4_ = fVar102 * fVar93;
          fVar104 = local_aa0._8_4_;
          auVar74._8_4_ = fVar104 * fVar93;
          fVar105 = local_aa0._12_4_;
          auVar74._12_4_ = fVar105 * fVar93;
          fVar106 = local_aa0._16_4_;
          auVar74._16_4_ = fVar106 * fVar93;
          fVar107 = local_aa0._20_4_;
          auVar74._20_4_ = fVar107 * fVar93;
          fVar126 = local_aa0._24_4_;
          auVar74._24_4_ = fVar126 * fVar93;
          auVar74._28_4_ = fVar93;
          auVar97 = vcmpps_avx(auVar74,local_ac0,1);
          fVar93 = *(float *)(ray + k * 4 + 0x100);
          auVar121 = ZEXT3264(CONCAT428(fVar93,CONCAT424(fVar93,CONCAT420(fVar93,CONCAT416(fVar93,
                                                  CONCAT412(fVar93,CONCAT48(fVar93,CONCAT44(fVar93,
                                                  fVar93))))))));
          auVar75._4_4_ = fVar93 * fVar103;
          auVar75._0_4_ = fVar93 * fVar102;
          auVar75._8_4_ = fVar93 * fVar104;
          auVar75._12_4_ = fVar93 * fVar105;
          auVar75._16_4_ = fVar93 * fVar106;
          auVar75._20_4_ = fVar93 * fVar107;
          auVar75._24_4_ = fVar93 * fVar126;
          auVar75._28_4_ = 0x7fffffff;
          auVar115 = vcmpps_avx(local_ac0,auVar75,2);
          auVar97 = vandps_avx(auVar97,auVar115);
          auVar94 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
          auVar96 = vpand_avx(auVar94,auVar96);
          auVar94 = vpmovzxwd_avx(auVar96);
          auVar94 = vpslld_avx(auVar94,0x1f);
          auVar95 = vpsrad_avx(auVar94,0x1f);
          auVar94 = vpunpckhwd_avx(auVar96,auVar96);
          auVar94 = vpslld_avx(auVar94,0x1f);
          auVar94 = vpsrad_avx(auVar94,0x1f);
          local_a20._16_16_ = auVar94;
          local_a20._0_16_ = auVar95;
          if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_a20 >> 0x7f,0) != '\0') ||
                (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar94 >> 0x3f,0) != '\0') ||
              (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar94[0xf] < '\0') {
            local_a80 = local_c60;
            local_a60 = (float)local_c20._0_4_;
            fStack_a5c = (float)local_c20._4_4_;
            fStack_a58 = fStack_c18;
            fStack_a54 = fStack_c14;
            fStack_a50 = fStack_c10;
            fStack_a4c = fStack_c0c;
            fStack_a48 = fStack_c08;
            uStack_a44 = uStack_c04;
            local_940 = local_b60;
            auVar115 = vrcpps_avx(local_aa0);
            fVar93 = auVar115._0_4_;
            auVar111._0_4_ = fVar102 * fVar93;
            fVar102 = auVar115._4_4_;
            auVar111._4_4_ = fVar103 * fVar102;
            fVar103 = auVar115._8_4_;
            auVar111._8_4_ = fVar104 * fVar103;
            fVar104 = auVar115._12_4_;
            auVar111._12_4_ = fVar105 * fVar104;
            fVar105 = auVar115._16_4_;
            auVar111._16_4_ = fVar106 * fVar105;
            fVar106 = auVar115._20_4_;
            auVar111._20_4_ = fVar107 * fVar106;
            fVar107 = auVar115._24_4_;
            auVar111._24_4_ = fVar126 * fVar107;
            auVar111._28_4_ = 0;
            auVar124._8_4_ = 0x3f800000;
            auVar124._0_8_ = 0x3f8000003f800000;
            auVar124._12_4_ = 0x3f800000;
            auVar124._16_4_ = 0x3f800000;
            auVar124._20_4_ = 0x3f800000;
            auVar124._24_4_ = 0x3f800000;
            auVar124._28_4_ = 0x3f800000;
            auVar97 = vsubps_avx(auVar124,auVar111);
            fStack_9a4 = auVar97._28_4_;
            fVar93 = fVar93 + fVar93 * auVar97._0_4_;
            fVar102 = fVar102 + fVar102 * auVar97._4_4_;
            fVar103 = fVar103 + fVar103 * auVar97._8_4_;
            fVar104 = fVar104 + fVar104 * auVar97._12_4_;
            fVar105 = fVar105 + fVar105 * auVar97._16_4_;
            fVar106 = fVar106 + fVar106 * auVar97._20_4_;
            fVar107 = fVar107 + fVar107 * auVar97._24_4_;
            local_9c0[0] = fVar93 * local_ac0._0_4_;
            local_9c0[1] = fVar102 * local_ac0._4_4_;
            local_9c0[2] = fVar103 * local_ac0._8_4_;
            local_9c0[3] = fVar104 * local_ac0._12_4_;
            fStack_9b0 = fVar105 * local_ac0._16_4_;
            fStack_9ac = fVar106 * local_ac0._20_4_;
            fStack_9a8 = fVar107 * local_ac0._24_4_;
            auVar76._4_4_ = fVar102 * local_b00._4_4_;
            auVar76._0_4_ = fVar93 * local_b00._0_4_;
            auVar76._8_4_ = fVar103 * local_b00._8_4_;
            auVar76._12_4_ = fVar104 * local_b00._12_4_;
            auVar76._16_4_ = fVar105 * local_b00._16_4_;
            auVar76._20_4_ = fVar106 * local_b00._20_4_;
            auVar76._24_4_ = fVar107 * local_b00._24_4_;
            auVar76._28_4_ = fStack_9a4;
            auVar97 = vminps_avx(auVar76,auVar124);
            auVar77._4_4_ = fVar102 * local_ae0._4_4_;
            auVar77._0_4_ = fVar93 * local_ae0._0_4_;
            auVar77._8_4_ = fVar103 * local_ae0._8_4_;
            auVar77._12_4_ = fVar104 * local_ae0._12_4_;
            auVar77._16_4_ = fVar105 * local_ae0._16_4_;
            auVar77._20_4_ = fVar106 * local_ae0._20_4_;
            auVar77._24_4_ = fVar107 * local_ae0._24_4_;
            auVar77._28_4_ = auVar115._28_4_ + fStack_9a4;
            auVar115 = vminps_avx(auVar77,auVar124);
            auVar100 = vsubps_avx(auVar124,auVar97);
            auVar110 = vsubps_avx(auVar124,auVar115);
            local_9e0 = vblendvps_avx(auVar115,auVar100,local_b60);
            local_a00 = vblendvps_avx(auVar97,auVar110,local_b60);
            local_980._4_4_ = (float)local_c20._4_4_ * (float)local_b80._4_4_;
            local_980._0_4_ = (float)local_c20._0_4_ * (float)local_b80._0_4_;
            local_980._8_4_ = fStack_c18 * fStack_b78;
            local_980._12_4_ = fStack_c14 * fStack_b74;
            local_980._16_4_ = fStack_c10 * fStack_b70;
            local_980._20_4_ = fStack_c0c * fStack_b6c;
            local_980._24_4_ = fStack_c08 * fStack_b68;
            local_980._28_4_ = local_a00._28_4_;
            local_960._4_4_ = fVar15 * (float)local_b80._4_4_;
            local_960._0_4_ = fVar129 * (float)local_b80._0_4_;
            local_960._8_4_ = fVar22 * fStack_b78;
            local_960._12_4_ = fVar29 * fStack_b74;
            local_960._16_4_ = fVar36 * fStack_b70;
            local_960._20_4_ = fVar43 * fStack_b6c;
            local_960._24_4_ = fVar50 * fStack_b68;
            local_960._28_4_ = uStack_b64;
            local_9a0[0] = fVar132 * (float)local_b80._0_4_;
            local_9a0[1] = fVar16 * (float)local_b80._4_4_;
            local_9a0[2] = fVar23 * fStack_b78;
            local_9a0[3] = fVar30 * fStack_b74;
            fStack_990 = fVar37 * fStack_b70;
            fStack_98c = fVar44 * fStack_b6c;
            fStack_988 = fVar51 * fStack_b68;
            uStack_984 = local_9e0._28_4_;
            auVar96 = vpsllw_avx(auVar96,0xf);
            auVar96 = vpacksswb_avx(auVar96,auVar96);
            uVar86 = (ulong)(byte)(SUB161(auVar96 >> 7,0) & 1 | (SUB161(auVar96 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar96 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar96 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar96 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar96 >> 0x3f,0) << 7);
            do {
              uVar11 = 0;
              if (uVar86 != 0) {
                for (; (uVar86 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar84 = *(uint *)(local_b20 + uVar11 * 4);
              pGVar9 = (((Scene *)auVar89)->geometries).items[uVar84].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0039e4dc:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar78;
                }
                local_c80 = auVar121._0_32_;
                local_c20 = auVar89;
                uVar1 = *(undefined4 *)(local_a00 + uVar11 * 4);
                local_8c0._4_4_ = uVar1;
                local_8c0._0_4_ = uVar1;
                local_8c0._8_4_ = uVar1;
                local_8c0._12_4_ = uVar1;
                local_8c0._16_4_ = uVar1;
                local_8c0._20_4_ = uVar1;
                local_8c0._24_4_ = uVar1;
                local_8c0._28_4_ = uVar1;
                local_8a0 = local_9c0[uVar11 - 8];
                local_c60._0_8_ = k;
                *(float *)(ray + k * 4 + 0x100) = local_9c0[uVar11];
                local_cb0.context = context->user;
                local_880 = *(undefined4 *)((long)&local_b40 + uVar11 * 4);
                fVar93 = local_9a0[uVar11];
                uVar1 = *(undefined4 *)(local_980 + uVar11 * 4);
                local_900._4_4_ = uVar1;
                local_900._0_4_ = uVar1;
                local_900._8_4_ = uVar1;
                local_900._12_4_ = uVar1;
                local_900._16_4_ = uVar1;
                local_900._20_4_ = uVar1;
                local_900._24_4_ = uVar1;
                local_900._28_4_ = uVar1;
                local_850 = vpshufd_avx(ZEXT416(uVar84),0);
                uVar1 = *(undefined4 *)(local_960 + uVar11 * 4);
                local_8e0._4_4_ = uVar1;
                local_8e0._0_4_ = uVar1;
                local_8e0._8_4_ = uVar1;
                local_8e0._12_4_ = uVar1;
                local_8e0._16_4_ = uVar1;
                local_8e0._20_4_ = uVar1;
                local_8e0._24_4_ = uVar1;
                local_8e0._28_4_ = uVar1;
                local_920[0] = (RTCHitN)SUB41(fVar93,0);
                local_920[1] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                local_920[4] = (RTCHitN)SUB41(fVar93,0);
                local_920[5] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                local_920[8] = (RTCHitN)SUB41(fVar93,0);
                local_920[9] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                local_920[0xc] = (RTCHitN)SUB41(fVar93,0);
                local_920[0xd] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                local_920[0x10] = (RTCHitN)SUB41(fVar93,0);
                local_920[0x11] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                local_920[0x14] = (RTCHitN)SUB41(fVar93,0);
                local_920[0x15] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                local_920[0x18] = (RTCHitN)SUB41(fVar93,0);
                local_920[0x19] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                local_920[0x1c] = (RTCHitN)SUB41(fVar93,0);
                local_920[0x1d] = (RTCHitN)(char)((uint)fVar93 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
                fStack_89c = local_8a0;
                fStack_898 = local_8a0;
                fStack_894 = local_8a0;
                fStack_890 = local_8a0;
                fStack_88c = local_8a0;
                fStack_888 = local_8a0;
                fStack_884 = local_8a0;
                uStack_87c = local_880;
                uStack_878 = local_880;
                uStack_874 = local_880;
                uStack_870 = local_880;
                uStack_86c = local_880;
                uStack_868 = local_880;
                uStack_864 = local_880;
                local_860 = local_850;
                vcmpps_avx(local_8c0,local_8c0,0xf);
                uStack_83c = (local_cb0.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_cb0.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ce0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar82 & 0xf) << 4));
                local_cd0 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)((int)uVar82 >> 4) * 0x10);
                local_cb0.valid = (int *)local_ce0;
                local_cb0.geometryUserPtr = pGVar9->userPtr;
                local_c40._0_8_ = ray;
                local_cb0.hit = local_920;
                local_cb0.N = 8;
                local_cb0.ray = (RTCRayN *)ray;
                if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->occlusionFilterN)(&local_cb0);
                }
                auVar96 = vpcmpeqd_avx(local_ce0,ZEXT816(0) << 0x40);
                auVar94 = vpcmpeqd_avx(local_cd0,ZEXT816(0) << 0x40);
                auVar119._16_16_ = auVar94;
                auVar119._0_16_ = auVar96;
                auVar97 = _DAT_01fe9960 & ~auVar119;
                if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar97 >> 0x7f,0) == '\0') &&
                      (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar97 >> 0xbf,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar97[0x1f]) {
                  auVar101._0_8_ = auVar96._0_8_ ^ 0xffffffffffffffff;
                  auVar101._8_4_ = auVar96._8_4_ ^ 0xffffffff;
                  auVar101._12_4_ = auVar96._12_4_ ^ 0xffffffff;
                  auVar101._16_4_ = auVar94._0_4_ ^ 0xffffffff;
                  auVar101._20_4_ = auVar94._4_4_ ^ 0xffffffff;
                  auVar101._24_4_ = auVar94._8_4_ ^ 0xffffffff;
                  auVar101._28_4_ = auVar94._12_4_ ^ 0xffffffff;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&local_cb0);
                  }
                  auVar96 = vpcmpeqd_avx(local_ce0,ZEXT816(0) << 0x40);
                  auVar94 = vpcmpeqd_avx(local_cd0,ZEXT816(0) << 0x40);
                  auVar112._16_16_ = auVar94;
                  auVar112._0_16_ = auVar96;
                  auVar101._0_8_ = auVar96._0_8_ ^ 0xffffffffffffffff;
                  auVar101._8_4_ = auVar96._8_4_ ^ 0xffffffff;
                  auVar101._12_4_ = auVar96._12_4_ ^ 0xffffffff;
                  auVar101._16_4_ = auVar94._0_4_ ^ 0xffffffff;
                  auVar101._20_4_ = auVar94._4_4_ ^ 0xffffffff;
                  auVar101._24_4_ = auVar94._8_4_ ^ 0xffffffff;
                  auVar101._28_4_ = auVar94._12_4_ ^ 0xffffffff;
                  auVar120._8_4_ = 0xff800000;
                  auVar120._0_8_ = 0xff800000ff800000;
                  auVar120._12_4_ = 0xff800000;
                  auVar120._16_4_ = 0xff800000;
                  auVar120._20_4_ = 0xff800000;
                  auVar120._24_4_ = 0xff800000;
                  auVar120._28_4_ = 0xff800000;
                  auVar97 = vblendvps_avx(auVar120,*(undefined1 (*) [32])(local_cb0.ray + 0x100),
                                          auVar112);
                  *(undefined1 (*) [32])(local_cb0.ray + 0x100) = auVar97;
                }
                k = local_c60._0_8_;
                ray = (RayK<8> *)local_c40._0_8_;
                if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar101 >> 0x7f,0) != '\0') ||
                      (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar101 >> 0xbf,0) != '\0') ||
                    (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar101[0x1f] < '\0') goto LAB_0039e4dc;
                auVar121 = ZEXT3264(local_c80);
                *(int *)(local_c40._0_8_ + local_c60._0_8_ * 4 + 0x100) = local_c80._0_4_;
                auVar89 = local_c20;
              }
              uVar86 = uVar86 ^ 1L << (uVar11 & 0x3f);
            } while (uVar86 != 0);
          }
        }
        lVar80 = lVar80 + 1;
      } while (lVar80 != uVar92 - 8);
    }
    auVar121 = ZEXT1664(local_b90);
    auVar122 = ZEXT1664(local_ba0);
    auVar125 = ZEXT1664(local_bb0);
    auVar143 = ZEXT1664(local_bf0);
    auVar159 = ZEXT1664(local_c00);
    fVar93 = local_bc0;
    fVar104 = fStack_bbc;
    fVar105 = fStack_bb8;
    fVar106 = fStack_bb4;
    fVar102 = local_bd0;
    fVar107 = fStack_bcc;
    fVar126 = fStack_bc8;
    fVar129 = fStack_bc4;
    fVar103 = local_be0;
    fVar132 = fStack_bdc;
    fVar134 = fStack_bd8;
    fVar136 = fStack_bd4;
joined_r0x0039dc98:
    bVar78 = puVar88 != &local_800;
    if (!bVar78) {
      return bVar78;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }